

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv__ipv6_link_local_scope_id(void)

{
  short *psVar1;
  int iVar2;
  undefined8 *puVar3;
  char extraout_DL;
  char cVar4;
  undefined8 in_RSI;
  ifaddrs *ifa;
  undefined8 *local_10;
  
  iVar2 = getifaddrs(&local_10);
  puVar3 = local_10;
  cVar4 = extraout_DL;
  if (iVar2 == 0) {
    for (; puVar3 != (undefined8 *)0x0; puVar3 = (undefined8 *)*puVar3) {
      psVar1 = (short *)puVar3[3];
      if (((psVar1 != (short *)0x0) && (*psVar1 == 10)) && ((char)psVar1[4] == -2)) {
        cVar4 = -*(char *)((long)psVar1 + 9);
      }
    }
    freeifaddrs(local_10,in_RSI,cVar4);
  }
  return 0;
}

Assistant:

static int uv__ipv6_link_local_scope_id(void) {
  struct sockaddr_in6* a6;
  int rv;
#if defined(_AIX)
  /* AIX & IBM i do not have ifaddrs
   * so fallback to use uv_interface_addresses */
  uv_interface_address_t* interfaces;
  uv_interface_address_t* ifa;
  int count, i;

  if (uv_interface_addresses(&interfaces, &count))
    return 0;

  rv = 0;

  for (ifa = interfaces; ifa != &interfaces[count]; ifa++) {
    if (uv__is_ipv6_link_local((struct sockaddr*) &ifa->address)) {
      rv = ifa->address.address6.sin6_scope_id;
      break;
    }
  }

  uv_free_interface_addresses(interfaces, count);

#else
  struct ifaddrs* ifa;
  struct ifaddrs* p;

  if (getifaddrs(&ifa))
    return 0;

  for (p = ifa; p != NULL; p = p->ifa_next)
    if (p->ifa_addr != NULL)
      if (uv__is_ipv6_link_local(p->ifa_addr))
        break;

  rv = 0;
  if (p != NULL) {
    a6 = (struct sockaddr_in6*) p->ifa_addr;
    rv = a6->sin6_scope_id;
  }

  freeifaddrs(ifa);
#endif /* defined(_AIX) */

  return rv;
}